

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Batchnorm.cpp
# Opt level: O3

void CoreMLConverter::convertCaffeBatchnorm(ConvertLayerParameters layerParameters)

{
  RepeatedPtrFieldBase *this;
  RepeatedField<float> *this_00;
  RepeatedField<float> *this_01;
  RepeatedField<float> *this_02;
  RepeatedField<float> *this_03;
  string *psVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  size_t __n;
  bool bVar5;
  int iVar6;
  Type *pTVar7;
  LogMessage *pLVar8;
  Type *pTVar9;
  Type *this_04;
  LayerUnion this_05;
  WeightParams *this_06;
  WeightParams *this_07;
  WeightParams *this_08;
  WeightParams *this_09;
  float *pfVar10;
  ScaleParameter *pSVar11;
  Type *pTVar12;
  long lVar13;
  RepeatedPtrField<caffe::BlobProto> *this_10;
  int iVar14;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar15;
  BatchNormParameter *pBVar16;
  long lVar17;
  long in_stack_00000008;
  RepeatedField<float> mean;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  int *in_stack_00000048;
  RepeatedField<float> variance;
  string TopName;
  RepeatedField<float> beta;
  RepeatedField<float> gamma;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_148;
  undefined1 local_128 [56];
  Type *local_f0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_e8;
  LogFinisher local_d9;
  undefined1 local_d8 [16];
  RepeatedField<float> local_c8;
  string local_b8;
  RepeatedField<float> local_98;
  RepeatedField<float> local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  int *local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_38;
  
  local_d8._8_8_ = local_d8._0_8_;
  local_40 = in_stack_00000048;
  iVar14 = *in_stack_00000048;
  this = (RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70);
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>(this,iVar14);
  local_38 = in_stack_00000030;
  iVar6 = getLayerIndex(pTVar7,in_stack_00000030);
  local_d8._0_8_ =
       google::protobuf::internal::RepeatedPtrFieldBase::
       Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                 ((RepeatedPtrFieldBase *)(mean._0_8_ + 0x70),iVar6);
  local_e8 = in_stack_00000028;
  local_f0 = pTVar7;
  if (((pTVar7->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     ((pTVar7->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"Must have 1 input and 1 output","");
    psVar1 = (pTVar7->name_).ptr_;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"BatchNorm","");
    errorInCaffeProto((string *)local_128,psVar1,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    pTVar7 = local_f0;
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    if ((pTVar7->top_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_128,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar8 = google::protobuf::internal::LogMessage::operator<<
                         ((LogMessage *)local_128,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar8);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_128);
    }
  }
  plVar2 = (long *)((pTVar7->top_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  lVar17 = *plVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,lVar17,plVar2[1] + lVar17);
  local_88.current_size_ = 0;
  local_88.total_size_ = 0;
  local_88.rep_ = (Rep *)0x0;
  local_98.current_size_ = 0;
  local_98.total_size_ = 0;
  local_98.rep_ = (Rep *)0x0;
  if (iVar14 < *(int *)(in_stack_00000008 + 0x78) + -1) {
    pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                       (this,iVar14 + 1);
    iVar6 = std::__cxx11::string::compare((char *)(pTVar9->type_).ptr_);
    lVar17 = local_d8._0_8_;
    if (iVar6 == 0) {
      pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (this,iVar14 + 1);
      bVar5 = false;
      if (((pTVar9->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
         ((pTVar9->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) goto LAB_003d35e4;
      puVar3 = (undefined8 *)((pTVar9->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0];
      if ((pTVar7->top_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_128,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar8 = google::protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)local_128,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar8);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_128);
      }
      puVar4 = (undefined8 *)((pTVar7->top_).super_RepeatedPtrFieldBase.rep_)->elements[0];
      __n = puVar3[1];
      if ((__n == puVar4[1]) &&
         ((__n == 0 || (iVar14 = bcmp((void *)*puVar3,(void *)*puVar4,__n), iVar14 == 0)))) {
        pSVar11 = pTVar9->scale_param_;
        if (pSVar11 == (ScaleParameter *)0x0) {
          pSVar11 = (ScaleParameter *)&caffe::_ScaleParameter_default_instance_;
        }
        if ((((pSVar11->axis_ == 1) || (pSVar11->axis_ == -3)) && (pSVar11->num_axes_ == 1)) &&
           (pSVar11->bias_term_ == true)) {
          iVar14 = getLayerIndex(pTVar9,local_38);
          pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                             ((RepeatedPtrFieldBase *)(mean._0_8_ + 0x70),iVar14);
          if ((pTVar7->blobs_).super_RepeatedPtrFieldBase.current_size_ == 2) {
            this_10 = &pTVar7->blobs_;
            pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                (&this_10->super_RepeatedPtrFieldBase,0);
            iVar14 = (pTVar12->data_).current_size_;
            pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                (&this_10->super_RepeatedPtrFieldBase,1);
            iVar6 = (pTVar12->data_).current_size_;
            pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                ((RepeatedPtrFieldBase *)(lVar17 + 0x70),0);
            if ((pTVar12->data_).current_size_ == (uint)(iVar14 == iVar6)) {
              google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&(pTVar9->top_).super_RepeatedPtrFieldBase,0);
              std::__cxx11::string::_M_assign((string *)&local_b8);
              pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                  (&this_10->super_RepeatedPtrFieldBase,0);
              google::protobuf::RepeatedField<float>::operator=(&local_88,&pTVar12->data_);
              pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                  (&this_10->super_RepeatedPtrFieldBase,1);
              google::protobuf::RepeatedField<float>::operator=(&local_98,&pTVar12->data_);
              *local_40 = *local_40 + 1;
              bVar5 = true;
              pTVar7 = local_f0;
              goto LAB_003d35e4;
            }
          }
          bVar5 = false;
          pTVar7 = local_f0;
          goto LAB_003d35e4;
        }
      }
    }
    bVar5 = false;
  }
  else {
    bVar5 = false;
    lVar17 = local_d8._0_8_;
  }
LAB_003d35e4:
  this_04 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)mean.rep_,(Type *)0x0);
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((pTVar7->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_128,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar8 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_128,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar8);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_128);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_58,
              (value_type *)((pTVar7->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_78,&local_b8);
  convertCaffeMetadata
            ((pTVar7->name_).ptr_,&local_58,&local_78,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)mean.rep_,local_e8);
  if (this_04->_oneof_case_[0] == 0xa0) {
    this_05 = this_04->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_04);
    this_04->_oneof_case_[0] = 0xa0;
    this_05.convolution_ = (ConvolutionLayerParams *)operator_new(0x48);
    CoreML::Specification::BatchnormLayerParams::BatchnormLayerParams(this_05.batchnorm_);
    (this_04->layer_).batchnorm_ = (BatchnormLayerParams *)this_05;
  }
  pBVar16 = pTVar7->batch_norm_param_;
  if (pBVar16 == (BatchNormParameter *)0x0) {
    pBVar16 = (BatchNormParameter *)&caffe::_BatchNormParameter_default_instance_;
  }
  if (*(int *)(lVar17 + 0x78) == 3) {
    iVar14 = 3;
  }
  else {
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"Must have 3 weight blobs for mean, variance and scale","");
    psVar1 = (pTVar7->name_).ptr_;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"BatchNorm","");
    errorInCaffeProto((string *)local_128,psVar1,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    pTVar7 = local_f0;
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    lVar17 = local_d8._0_8_;
    iVar14 = *(int *)(local_d8._0_8_ + 0x78);
    if (iVar14 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_128,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar8 = google::protobuf::internal::LogMessage::operator<<
                         ((LogMessage *)local_128,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar8);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_128);
      iVar14 = *(int *)(lVar17 + 0x78);
    }
  }
  lVar13 = *(long *)(lVar17 + 0x80);
  local_e8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(ulong)*(uint *)(*(long *)(lVar13 + 8) + 0x18);
  if (iVar14 < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_128,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar8 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_128,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar8);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_128);
    lVar13 = *(long *)(lVar17 + 0x80);
  }
  iVar14 = *(int *)(*(long *)(lVar13 + 0x10) + 0x18);
  if ((int)local_e8 == 0) {
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"Empty mean vector blob","")
    ;
    psVar1 = (pTVar7->name_).ptr_;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"BatchNorm","");
    errorInCaffeProto((string *)local_128,psVar1,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    pTVar7 = local_f0;
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    lVar17 = local_d8._0_8_;
  }
  if (iVar14 == 0) {
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"Empty variance vector blob","");
    psVar1 = (pTVar7->name_).ptr_;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"BatchNorm","");
    errorInCaffeProto((string *)local_128,psVar1,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    pTVar7 = local_f0;
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    lVar17 = local_d8._0_8_;
  }
  pmVar15 = local_e8;
  if (iVar14 != (int)local_e8) {
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"Lengths of mean/variance vectors do not match","");
    psVar1 = (pTVar7->name_).ptr_;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"BatchNorm","");
    errorInCaffeProto((string *)local_128,psVar1,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    pTVar7 = local_f0;
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    lVar17 = local_d8._0_8_;
  }
  if (*(int *)(lVar17 + 0x78) < 3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_128,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar8 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_128,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar8);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_128);
  }
  if (*(int *)(*(long *)(*(long *)(lVar17 + 0x80) + 0x18) + 0x18) == 0) {
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"Empty scale factor blob","");
    psVar1 = (pTVar7->name_).ptr_;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"BatchNorm","");
    errorInCaffeProto((string *)local_128,psVar1,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    pmVar15 = local_e8;
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    lVar17 = local_d8._0_8_;
  }
  (this_05.pooling_)->type_ = (int)pBVar16->eps_;
  if ((int)pmVar15 < 0) {
    __assert_fail("C >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Batchnorm.cpp"
                  ,0x80,
                  "void CoreMLConverter::convertCaffeBatchnorm(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  (this_05.batchnorm_)->channels_ = (uint64)pmVar15;
  if (*(int *)(lVar17 + 0x78) < 3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_128,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar8 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_128,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar8);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_128);
  }
  lVar13 = *(long *)(*(long *)(lVar17 + 0x80) + 0x18);
  if (*(int *)(lVar13 + 0x18) < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_128,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar8 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_128,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar8);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_128);
  }
  local_d8 = ZEXT416(*(uint *)(*(long *)(lVar13 + 0x20) + 8));
  if (*(int *)(lVar17 + 0x78) < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_128,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar8 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_128,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar8);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_128);
  }
  lVar13 = *(long *)(*(long *)(lVar17 + 0x80) + 8);
  local_148._M_dataplus._M_p = (pointer)0x0;
  local_148._M_string_length = 0;
  if (*(int *)(lVar13 + 0x18) != 0) {
    google::protobuf::RepeatedField<float>::Reserve
              ((RepeatedField<float> *)&local_148,*(int *)(lVar13 + 0x18));
    memcpy((long *)(local_148._M_string_length + 8),(void *)(*(long *)(lVar13 + 0x20) + 8),
           (long)*(int *)(lVar13 + 0x18) << 2);
    local_148._M_dataplus._M_p._0_4_ = *(undefined4 *)(lVar13 + 0x18);
  }
  if (*(int *)(lVar17 + 0x78) < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_128,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar8 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_128,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_d9,pLVar8);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_128);
  }
  lVar17 = *(long *)(*(long *)(lVar17 + 0x80) + 0x10);
  local_c8.current_size_ = 0;
  local_c8.total_size_ = 0;
  local_c8.rep_ = (Rep *)0x0;
  if (*(int *)(lVar17 + 0x18) != 0) {
    google::protobuf::RepeatedField<float>::Reserve(&local_c8,*(int *)(lVar17 + 0x18));
    memcpy((local_c8.rep_)->elements,(void *)(*(long *)(lVar17 + 0x20) + 8),
           (long)*(int *)(lVar17 + 0x18) << 2);
    local_c8.current_size_ = *(int *)(lVar17 + 0x18);
  }
  this_06 = (this_05.batchnorm_)->mean_;
  if (this_06 == (WeightParams *)0x0) {
    this_06 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(this_06);
    (this_05.batchnorm_)->mean_ = this_06;
  }
  this_07 = (this_05.batchnorm_)->variance_;
  if (this_07 == (WeightParams *)0x0) {
    this_07 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(this_07);
    (this_05.batchnorm_)->variance_ = this_07;
  }
  this_08 = (WeightParams *)((this_05.activation_)->NonlinearityType_).relu_;
  if (this_08 == (WeightParams *)0x0) {
    this_08 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(this_08);
    ((this_05.activation_)->NonlinearityType_).relu_ = (ActivationReLU *)this_08;
  }
  this_09 = (this_05.innerproduct_)->bias_;
  if (this_09 == (WeightParams *)0x0) {
    this_09 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(this_09);
    (this_05.innerproduct_)->bias_ = this_09;
  }
  pmVar15 = local_e8;
  this_00 = &this_06->floatvalue_;
  iVar14 = (int)local_e8;
  if (this_00->current_size_ < iVar14) {
    google::protobuf::RepeatedField<float>::Reserve(this_00,iVar14);
    iVar6 = this_00->current_size_;
    if (iVar6 != iVar14) {
      memset(((this_06->floatvalue_).rep_)->elements + iVar6,0,(long)pmVar15 * 4 + (long)iVar6 * -4)
      ;
    }
  }
  this_03 = &this_07->floatvalue_;
  this_00->current_size_ = iVar14;
  if (this_03->current_size_ < iVar14) {
    google::protobuf::RepeatedField<float>::Reserve(this_03,iVar14);
    iVar6 = this_03->current_size_;
    if (iVar6 != iVar14) {
      memset(((this_07->floatvalue_).rep_)->elements + iVar6,0,(long)pmVar15 * 4 + (long)iVar6 * -4)
      ;
    }
  }
  this_01 = &this_08->floatvalue_;
  this_03->current_size_ = iVar14;
  if (this_01->current_size_ < iVar14) {
    google::protobuf::RepeatedField<float>::Reserve(this_01,iVar14);
    iVar6 = this_01->current_size_;
    if (iVar6 != iVar14) {
      memset(((this_08->floatvalue_).rep_)->elements + iVar6,0,(long)pmVar15 * 4 + (long)iVar6 * -4)
      ;
    }
  }
  this_02 = &this_09->floatvalue_;
  this_01->current_size_ = iVar14;
  if (this_02->current_size_ < iVar14) {
    google::protobuf::RepeatedField<float>::Reserve(this_02,iVar14);
    iVar6 = this_02->current_size_;
    if (iVar6 != iVar14) {
      memset(((this_09->floatvalue_).rep_)->elements + iVar6,0,(long)pmVar15 * 4 + (long)iVar6 * -4)
      ;
    }
  }
  this_02->current_size_ = iVar14;
  if (iVar14 != 0) {
    local_d8 = ZEXT416(~-(uint)((float)local_d8._0_4_ < 1e-05) & (uint)(1.0 / (float)local_d8._0_4_)
                      );
    iVar14 = 0;
    do {
      pfVar10 = google::protobuf::RepeatedField<float>::Mutable
                          ((RepeatedField<float> *)&local_148,iVar14);
      local_128._0_4_ = *pfVar10 * (float)local_d8._0_4_;
      google::protobuf::RepeatedField<float>::Set(this_00,iVar14,(float *)local_128);
      pfVar10 = google::protobuf::RepeatedField<float>::Mutable(&local_c8,iVar14);
      local_128._0_4_ = *pfVar10 * (float)local_d8._0_4_;
      google::protobuf::RepeatedField<float>::Set(this_03,iVar14,(float *)local_128);
      if (bVar5) {
        pfVar10 = google::protobuf::RepeatedField<float>::Mutable(&local_88,iVar14);
        google::protobuf::RepeatedField<float>::Set(this_01,iVar14,pfVar10);
        pfVar10 = google::protobuf::RepeatedField<float>::Mutable(&local_98,iVar14);
        google::protobuf::RepeatedField<float>::Set(this_02,iVar14,pfVar10);
      }
      else {
        local_128._0_4_ = 1.0;
        google::protobuf::RepeatedField<float>::Set(this_01,iVar14,(float *)local_128);
        local_128._0_8_ = (ulong)(uint)local_128._4_4_ << 0x20;
        google::protobuf::RepeatedField<float>::Set(this_02,iVar14,(float *)local_128);
      }
      iVar14 = iVar14 + 1;
    } while ((int)local_e8 != iVar14);
  }
  if ((local_c8.rep_ != (Rep *)0x0) && ((local_c8.rep_)->arena == (Arena *)0x0)) {
    operator_delete(local_c8.rep_,(long)local_c8.total_size_ * 4 + 8);
  }
  if (((long *)local_148._M_string_length != (long *)0x0) &&
     (*(long *)local_148._M_string_length == 0)) {
    operator_delete((void *)local_148._M_string_length,
                    (long)local_148._M_dataplus._M_p._4_4_ * 4 + 8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  if ((local_98.rep_ != (Rep *)0x0) && ((local_98.rep_)->arena == (Arena *)0x0)) {
    operator_delete(local_98.rep_,(long)local_98.total_size_ * 4 + 8);
  }
  if ((local_88.rep_ != (Rep *)0x0) && ((local_88.rep_)->arena == (Arena *)0x0)) {
    operator_delete(local_88.rep_,(long)local_88.total_size_ * 4 + 8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CoreMLConverter::convertCaffeBatchnorm(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    /*
     If Batchnorm layer is followed by a Scale layer, we try to fuse the two into 1 CoreML Batchnorm layer (its more efficient).
     */
    
    bool fuseScale = false;
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),"BatchNorm");
    }
    
    std::string TopName = caffeLayer.top(0);
    ::google::protobuf::RepeatedField<float> gamma;
    ::google::protobuf::RepeatedField<float> beta;
    /*
     Check whether Scale layer is to be fused: several conditions must be satisfied
     */
    //check whether the current BN is not the last layer and that the next layer is a "Scale" layer
    if (layerId < layerParameters.prototxt.layer_size()-1 && layerParameters.prototxt.layer(layerId+1).type() == "Scale"){
        const caffe::LayerParameter& caffeScaleLayer = layerParameters.prototxt.layer(layerId+1);
        
        //check whether the Scale layer has 1 bottom and top. Its bottom must be same as BN layer's top,
        //so that we know for sure that they are connected.
        if (caffeScaleLayer.bottom_size() == 1 && caffeScaleLayer.top_size() == 1 &&
            caffeScaleLayer.bottom(0) == caffeLayer.top(0)){
            
            const caffe::ScaleParameter& caffeLayerParamsScale = caffeScaleLayer.scale_param();
            
            //check that the Scale layer only applies scale to the channel axis and that it also includes the bias term.
            if ((caffeLayerParamsScale.axis() == 1 || caffeLayerParamsScale.axis() == -3) &&
                caffeLayerParamsScale.num_axes() == 1 && caffeLayerParamsScale.bias_term()){
                
                int layerIdWeightsScale = CoreMLConverter::getLayerIndex(caffeScaleLayer,layerParameters.mapCaffeLayerNamesToIndex);
                const caffe::LayerParameter& caffeScaleLayerWeights = layerParameters.protoweights.layer(layerIdWeightsScale);
                
                //check that the weights proto message corresponding to the scale layer is correct
                if (caffeScaleLayerWeights.blobs_size() == 2 &&
                    caffeScaleLayerWeights.blobs(0).data_size() == caffeScaleLayerWeights.blobs(1).data_size()
                    == caffeLayerWeights.blobs(0).data_size()){
                    
                    //All conditions are satisfied: Scale layer can now be fused with the BN layer.
                    fuseScale = true;
                    TopName = caffeScaleLayer.top(0);
                    gamma = caffeScaleLayerWeights.blobs(0).data();
                    beta = caffeScaleLayerWeights.blobs(1).data();
                    (*layerParameters.layerId)++;
                    //Succesfully fused batchNorm and scale layers.
                    
                }
            }
        }
    }
    
    #pragma unused(gamma)
    #pragma unused(beta)
    
    //Write Layer metadata
    ::google::protobuf::RepeatedPtrField< ::CoreML::Specification::NeuralNetworkLayer >* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    bottom.push_back(caffeLayer.bottom(0));
    top.push_back(TopName);
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    
    Specification::BatchnormLayerParams* specLayerParams = specLayer->mutable_batchnorm();
    const caffe::BatchNormParameter& caffeLayerParamsBN = caffeLayer.batch_norm_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerWeights.blobs_size()!=3) {
        CoreMLConverter::errorInCaffeProto("Must have 3 weight blobs for mean, variance and scale",caffeLayer.name(),"BatchNorm");
    }
    if (!caffeLayerParamsBN.use_global_stats()){
        /*
         WARNING: BatchNorm paramater 'use_global_stats' is False. It will be ignored during inference.
        The converter will look for mean/variance weights anyways. If they are not found, it will error out.
        */
    }
    //***************************************************************
    
    int C = caffeLayerWeights.blobs(0).data_size();
    int varianceLength = caffeLayerWeights.blobs(1).data_size();
    
    //****Some error checking in caffe file*************************
    if (C == 0){
        CoreMLConverter::errorInCaffeProto("Empty mean vector blob",caffeLayer.name(),"BatchNorm");
    }
    if (varianceLength == 0){
        CoreMLConverter::errorInCaffeProto("Empty variance vector blob",caffeLayer.name(),"BatchNorm");
    }
    if (varianceLength != C){
        CoreMLConverter::errorInCaffeProto("Lengths of mean/variance vectors do not match",caffeLayer.name(),"BatchNorm");
    }
    if (caffeLayerWeights.blobs(2).data_size() == 0){
        CoreMLConverter::errorInCaffeProto("Empty scale factor blob",caffeLayer.name(),"BatchNorm");
    }
    //***************************************************************
    
    specLayerParams->set_epsilon(caffeLayerParamsBN.eps());
    assert(C >= 0);
    specLayerParams->set_channels(static_cast<uint64_t>(C));
    float scale = caffeLayerWeights.blobs(2).data(0);
    float multiplicativeScale = (scale < 1e-5f) ? 0 : 1/scale;
    ::google::protobuf::RepeatedField<float> mean = caffeLayerWeights.blobs(0).data();
    ::google::protobuf::RepeatedField<float> variance = caffeLayerWeights.blobs(1).data();
    ::google::protobuf::RepeatedField<float>* meanWrite = specLayerParams->mutable_mean()->mutable_floatvalue();
    ::google::protobuf::RepeatedField<float>* varianceWrite = specLayerParams->mutable_variance()->mutable_floatvalue();
    ::google::protobuf::RepeatedField<float>* gammaWrite = specLayerParams->mutable_gamma()->mutable_floatvalue();
    ::google::protobuf::RepeatedField<float>* betaWrite = specLayerParams->mutable_beta()->mutable_floatvalue();
    meanWrite->Resize(C, 0.0);
    varianceWrite->Resize(C, 0.0);
    gammaWrite->Resize(C, 0.0);
    betaWrite->Resize(C, 0.0);
    for (int i=0; i<C; i++){
        meanWrite->Set(i,mean[i] * multiplicativeScale);
        varianceWrite->Set(i,variance[i] * multiplicativeScale);
        if (fuseScale){
            gammaWrite->Set(i, gamma[i]);
            betaWrite->Set(i, beta[i]);
        } else{
            gammaWrite->Set(i,1.0);
            betaWrite->Set(i,0.0);
        }
    }
}